

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O0

bool EV_StartWaggle(int tag,line_t_conflict *line,int height,int speed,int offset,int timer,
                   bool ceiling)

{
  bool bVar1;
  int iVar2;
  sector_t_conflict *sec;
  DCeilingWaggle *this;
  DFloorWaggle *this_00;
  sector_t_conflict *len;
  double dVar3;
  int local_74;
  FSectorTagIterator local_4c;
  FSectorTagIterator itr;
  bool retCode;
  DWaggleBase *waggle;
  sector_t_conflict *sector;
  int sectorIndex;
  bool ceiling_local;
  int timer_local;
  int offset_local;
  int speed_local;
  int height_local;
  line_t_conflict *line_local;
  int tag_local;
  
  itr.searchtag._3_1_ = 0;
  len = (sector_t_conflict *)(ulong)(uint)tag;
  FSectorTagIterator::FSectorTagIterator(&local_4c,tag,line);
LAB_0055e809:
  iVar2 = FSectorTagIterator::Next(&local_4c);
  if (iVar2 < 0) {
    return (bool)(itr.searchtag._3_1_ & 1);
  }
  sec = sectors + iVar2;
  if (!ceiling) goto code_r0x0055e840;
  goto LAB_0055e84f;
code_r0x0055e840:
  len = (sector_t_conflict *)0x0;
  bVar1 = sector_t::PlaneMoving((sector_t *)sec,0);
  if (!bVar1) {
LAB_0055e84f:
    if (ceiling) {
      len = (sector_t_conflict *)0x1;
      bVar1 = sector_t::PlaneMoving((sector_t *)sec,1);
      if (bVar1) goto LAB_0055e809;
    }
    itr.searchtag._3_1_ = 1;
    if (ceiling) {
      this = (DCeilingWaggle *)DObject::operator_new((DObject *)0x80,(size_t)len);
      len = sec;
      DCeilingWaggle::DCeilingWaggle(this,sec);
      unique0x10000231 = (DFloorWaggle *)this;
      dVar3 = secplane_t::fD(&sec->ceilingplane);
      (((DCeilingWaggle *)stack0xffffffffffffffc0)->super_DWaggleBase).m_OriginalDist = dVar3;
    }
    else {
      this_00 = (DFloorWaggle *)DObject::operator_new((DObject *)0x80,(size_t)len);
      len = sec;
      DFloorWaggle::DFloorWaggle(this_00,sec);
      unique0x10000229 = this_00;
      dVar3 = secplane_t::fD(&sec->floorplane);
      (((DCeilingWaggle *)stack0xffffffffffffffc0)->super_DWaggleBase).m_OriginalDist = dVar3;
    }
    (((DCeilingWaggle *)stack0xffffffffffffffc0)->super_DWaggleBase).m_Accumulator = (double)offset;
    (((DCeilingWaggle *)stack0xffffffffffffffc0)->super_DWaggleBase).m_AccDelta =
         (double)speed / 64.0;
    (((DCeilingWaggle *)stack0xffffffffffffffc0)->super_DWaggleBase).m_Scale = 0.0;
    (((DCeilingWaggle *)stack0xffffffffffffffc0)->super_DWaggleBase).m_TargetScale =
         (double)height / 64.0;
    (((DCeilingWaggle *)stack0xffffffffffffffc0)->super_DWaggleBase).m_ScaleDelta =
         (((DCeilingWaggle *)stack0xffffffffffffffc0)->super_DWaggleBase).m_TargetScale /
         (double)((height * 0x69) / 0xff + 0x23);
    if (timer == 0) {
      local_74 = -1;
    }
    else {
      local_74 = timer * 0x23;
    }
    (((DCeilingWaggle *)stack0xffffffffffffffc0)->super_DWaggleBase).m_Ticker = local_74;
    (((DCeilingWaggle *)stack0xffffffffffffffc0)->super_DWaggleBase).m_State = 1;
  }
  goto LAB_0055e809;
}

Assistant:

bool EV_StartWaggle (int tag, line_t *line, int height, int speed, int offset,
	int timer, bool ceiling)
{
	int sectorIndex;
	sector_t *sector;
	DWaggleBase *waggle;
	bool retCode;

	retCode = false;

	FSectorTagIterator itr(tag, line);

	while ((sectorIndex = itr.Next()) >= 0)
	{
		sector = &sectors[sectorIndex];
		if ((!ceiling && sector->PlaneMoving(sector_t::floor)) || 
			(ceiling && sector->PlaneMoving(sector_t::ceiling)))
		{ // Already busy with another thinker
			continue;
		}
		retCode = true;
		if (ceiling)
		{
			waggle = new DCeilingWaggle (sector);
			waggle->m_OriginalDist = sector->ceilingplane.fD();
		}
		else
		{
			waggle = new DFloorWaggle (sector);
			waggle->m_OriginalDist = sector->floorplane.fD();
		}
		waggle->m_Accumulator = offset;
		waggle->m_AccDelta = speed / 64.;
		waggle->m_Scale = 0;
		waggle->m_TargetScale = height / 64.;
		waggle->m_ScaleDelta = waggle->m_TargetScale / (TICRATE + ((3 * TICRATE)*height) / 255);
		waggle->m_Ticker = timer ? timer*TICRATE : -1;
		waggle->m_State = WGLSTATE_EXPAND;
	}
	return retCode;
}